

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  bool bVar1;
  Exception *pEVar2;
  ExceptionCallback *pEVar3;
  Fault local_3c8;
  Fault f_1;
  Fault f;
  Exception *e;
  undefined1 local_378 [8];
  Maybe<kj::Exception> exception;
  Maybe<kj::Exception> local_1e0;
  undefined1 local_80 [8];
  SchemaLoader loader;
  Own<capnp::MallocMessageBuilder> local_48;
  Maybe<kj::Own<capnp::MallocMessageBuilder>_> local_38;
  undefined1 local_28 [8];
  Maybe<kj::Own<capnp::MallocMessageBuilder>_> exampleBuilder;
  uint sharedOrdinalCount_local;
  ChangeKind changeKind_local;
  
  exampleBuilder.ptr.ptr._4_4_ = sharedOrdinalCount;
  kj::Maybe<kj::Own<capnp::MallocMessageBuilder>_>::Maybe
            ((Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_28);
  if (changeKind != INCOMPATIBLE) {
    kj::heap<capnp::MallocMessageBuilder>();
    kj::Maybe<kj::Own<capnp::MallocMessageBuilder>_>::Maybe(&local_38,&local_48);
    kj::Maybe<kj::Own<capnp::MallocMessageBuilder>_>::operator=
              ((Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_28,&local_38);
    kj::Maybe<kj::Own<capnp::MallocMessageBuilder>_>::~Maybe(&local_38);
    kj::Own<capnp::MallocMessageBuilder>::~Own(&local_48);
  }
  SchemaLoader::SchemaLoader((SchemaLoader *)local_80);
  exception.ptr.field_1._336_8_ = file1._reader.segment;
  loadFile(&local_1e0,file1,(SchemaLoader *)local_80,true,
           (Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_28,exampleBuilder.ptr.ptr._4_4_);
  kj::Maybe<kj::Exception>::~Maybe(&local_1e0);
  loadFile((Maybe<kj::Exception> *)local_378,file2,(SchemaLoader *)local_80,false,
           (Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_28,exampleBuilder.ptr.ptr._4_4_);
  if (changeKind == COMPATIBLE) {
    pEVar2 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_378);
    if (pEVar2 == (Exception *)0x0) {
      sharedOrdinalCount_local._3_1_ = true;
    }
    else {
      pEVar3 = kj::getExceptionCallback();
      pEVar2 = kj::mv<kj::Exception>(pEVar2);
      (*pEVar3->_vptr_ExceptionCallback[3])(pEVar3,pEVar2);
      sharedOrdinalCount_local._3_1_ = false;
    }
  }
  else if (changeKind == INCOMPATIBLE) {
    bVar1 = kj::Maybe<kj::Exception>::operator!=((Maybe<kj::Exception> *)local_378,(void *)0x0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != nullptr","file1, file2",&file1,&file2);
      kj::_::Debug::Fault::fatal(&f_1);
    }
    sharedOrdinalCount_local._3_1_ = false;
  }
  else {
    if (changeKind != SUBTLY_COMPATIBLE) {
      kj::_::Debug::Fault::Fault
                (&local_3c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2ee,FAILED,"changeKind == SUBTLY_COMPATIBLE","");
      kj::_::Debug::Fault::fatal(&local_3c8);
    }
    sharedOrdinalCount_local._3_1_ = true;
  }
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_378);
  SchemaLoader::~SchemaLoader((SchemaLoader *)local_80);
  kj::Maybe<kj::Own<capnp::MallocMessageBuilder>_>::~Maybe
            ((Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_28);
  return sharedOrdinalCount_local._3_1_;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_MAYBE(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(*e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != nullptr, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}